

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args;
  SyntaxList<slang::syntax::MemberSyntax> *args_5;
  CheckerDeclarationSyntax *pCVar1;
  DeepCloneVisitor visitor_1;
  DeepCloneVisitor visitor;
  AssertionItemPortListSyntax *local_58;
  Token local_50;
  Token local_40;
  Token local_30;
  
  args = deepClone<slang::syntax::AttributeInstanceSyntax>
                   ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x18),
                    (BumpAllocator *)__child_stack);
  local_30 = parsing::Token::deepClone((Token *)(__fn + 0x50),(BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x60),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x70) == (SyntaxNode *)0x0) {
    local_58 = (AssertionItemPortListSyntax *)0x0;
  }
  else {
    local_58 = (AssertionItemPortListSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x70),&visitor,(BumpAllocator *)__child_stack);
  }
  _visitor = parsing::Token::deepClone((Token *)(__fn + 0x78),(BumpAllocator *)__child_stack);
  args_5 = deepClone<slang::syntax::MemberSyntax>
                     ((SyntaxList<slang::syntax::MemberSyntax> *)(__fn + 0x88),
                      (BumpAllocator *)__child_stack);
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0xc0),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0xd0) == (SyntaxNode *)0x0) {
    _visitor_1 = (SyntaxNode *)0x0;
  }
  else {
    _visitor_1 = detail::
                 visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                           (*(SyntaxNode **)(__fn + 0xd0),&visitor_1,(BumpAllocator *)__child_stack)
    ;
  }
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::CheckerDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::syntax::AssertionItemPortListSyntax*,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::MemberSyntax>&,slang::parsing::Token,slang::syntax::NamedBlockClauseSyntax*>
                     ((BumpAllocator *)__child_stack,args,&local_30,&local_40,&local_58,
                      (Token *)&visitor,args_5,&local_50,(NamedBlockClauseSyntax **)&visitor_1);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const CheckerDeclarationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<CheckerDeclarationSyntax>(
        *deepClone(node.attributes, alloc),
        node.keyword.deepClone(alloc),
        node.name.deepClone(alloc),
        node.portList ? deepClone(*node.portList, alloc) : nullptr,
        node.semi.deepClone(alloc),
        *deepClone(node.members, alloc),
        node.end.deepClone(alloc),
        node.endBlockName ? deepClone(*node.endBlockName, alloc) : nullptr
    );
}